

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_2c8643::VectorType::printLeft(VectorType *this,OutputStream *S)

{
  void *pvVar1;
  void *pvVar2;
  Node *this_00;
  StringView R;
  StringView R_00;
  StringView SVar3;
  
  if (this->IsPixel == true) {
    R.Last = "";
    R.First = "pixel vector[";
    OutputStream::operator+=(S,R);
  }
  else {
    Node::print(this->BaseType,S);
    SVar3.Last = "";
    SVar3.First = " vector[";
    OutputStream::operator+=(S,SVar3);
    pvVar1 = (this->Dimension).First;
    pvVar2 = (this->Dimension).Second;
    if (pvVar2 == (void *)0x0 && pvVar1 != (void *)0x0) {
      this_00 = NodeOrString::asNode(&this->Dimension);
      Node::print(this_00,S);
      goto LAB_0017eb65;
    }
    if (pvVar2 == (void *)0x0 || pvVar1 == (void *)0x0) goto LAB_0017eb65;
  }
  SVar3 = NodeOrString::asString(&this->Dimension);
  OutputStream::operator+=(S,SVar3);
LAB_0017eb65:
  R_00.Last = "";
  R_00.First = "]";
  OutputStream::operator+=(S,R_00);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    if (IsPixel) {
      S += "pixel vector[";
      S += Dimension.asString();
      S += "]";
    } else {
      BaseType->print(S);
      S += " vector[";
      if (Dimension.isNode())
        Dimension.asNode()->print(S);
      else if (Dimension.isString())
        S += Dimension.asString();
      S += "]";
    }
  }